

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O3

int read_UTF8_ch(char **st)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  
  pbVar4 = (byte *)*st;
  bVar1 = *pbVar4;
  if (-1 < (char)bVar1) {
    *st = (char *)(pbVar4 + 1);
    return (int)(char)*pbVar4;
  }
  if ((bVar1 & 0xe0) == 0xc0) {
    *st = (char *)(pbVar4 + 1);
    uVar6 = (*pbVar4 & 0x1f) << 6;
    *st = (char *)(pbVar4 + 2);
    bVar1 = pbVar4[1];
  }
  else {
    *st = (char *)(pbVar4 + 1);
    bVar2 = *pbVar4;
    *st = (char *)(pbVar4 + 2);
    bVar3 = pbVar4[1];
    *st = (char *)(pbVar4 + 3);
    uVar6 = pbVar4[2] & 0x3f;
    if ((bVar1 & 0xf0) == 0xe0) {
      uVar5 = (bVar3 & 0x3f) << 6 | (bVar2 & 0xf) << 0xc;
      goto LAB_0010d093;
    }
    uVar6 = uVar6 << 6 | (bVar3 & 0x3f) << 0xc | (bVar2 & 7) << 0x12;
    *st = (char *)(pbVar4 + 4);
    bVar1 = pbVar4[3];
  }
  uVar5 = bVar1 & 0x3f;
LAB_0010d093:
  return uVar5 | uVar6;
}

Assistant:

int read_UTF8_ch(const char** st) {
    const char*& s = *st;
    if ((*s & 0x80) == 0)
        return *s++;
    if ((*s & 0xE0) == 0xC0) {
        int ch = (*s++ & 0x1F) << 6;
        return ch | (*s++ & 0x3F);
    }
    if ((*s & 0xF0) == 0xE0) {
        int ch = (*s++ & 0x0F) << 12;
        ch |= (*s++ & 0x3F) << 6;
        return ch | (*s++ & 0x3F);
    }
    int ch = (*s++ & 0x07) << 18;
    ch |= (*s++ & 0x3F) << 12;
    ch |= (*s++ & 0x3F) << 6;
    return ch | (*s++ & 0x3F);
}